

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoli.c
# Opt level: O0

int fffi2i2(short *input,long ntodo,double scale,double zero,int nullcheck,short tnull,short nullval
           ,char *nullarray,int *anynull,short *output,int *status)

{
  short in_CX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  undefined2 in_R8W;
  long in_R9;
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  double dvalue;
  long ii;
  undefined8 local_38;
  
  if (in_EDX == 0) {
    if (((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) || ((in_XMM1_Qa != 0.0 || (NAN(in_XMM1_Qa))))) {
      for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
        dVar1 = (double)(int)*(short *)((long)in_RDI + local_38 * 2) * in_XMM0_Qa + in_XMM1_Qa;
        if (-32768.49 <= dVar1) {
          if (dVar1 <= 32767.49) {
            *(short *)(ii + local_38 * 2) = (short)(int)dVar1;
          }
          else {
            nullarray[0] = -0xb;
            nullarray[1] = -1;
            nullarray[2] = -1;
            nullarray[3] = -1;
            *(undefined2 *)(ii + local_38 * 2) = 0x7fff;
          }
        }
        else {
          nullarray[0] = -0xb;
          nullarray[1] = -1;
          nullarray[2] = -1;
          nullarray[3] = -1;
          *(undefined2 *)(ii + local_38 * 2) = 0x8000;
        }
      }
    }
    else {
      memmove((void *)ii,in_RDI,in_RSI << 1);
    }
  }
  else if ((((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) || (in_XMM1_Qa != 0.0)) || (NAN(in_XMM1_Qa)))
  {
    for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
      if (*(short *)((long)in_RDI + local_38 * 2) == in_CX) {
        *(undefined4 *)dvalue = 1;
        if (in_EDX == 1) {
          *(undefined2 *)(ii + local_38 * 2) = in_R8W;
        }
        else {
          *(undefined1 *)(in_R9 + local_38) = 1;
        }
      }
      else {
        dVar1 = (double)(int)*(short *)((long)in_RDI + local_38 * 2) * in_XMM0_Qa + in_XMM1_Qa;
        if (-32768.49 <= dVar1) {
          if (dVar1 <= 32767.49) {
            *(short *)(ii + local_38 * 2) = (short)(int)dVar1;
          }
          else {
            nullarray[0] = -0xb;
            nullarray[1] = -1;
            nullarray[2] = -1;
            nullarray[3] = -1;
            *(undefined2 *)(ii + local_38 * 2) = 0x7fff;
          }
        }
        else {
          nullarray[0] = -0xb;
          nullarray[1] = -1;
          nullarray[2] = -1;
          nullarray[3] = -1;
          *(undefined2 *)(ii + local_38 * 2) = 0x8000;
        }
      }
    }
  }
  else {
    for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
      if (*(short *)((long)in_RDI + local_38 * 2) == in_CX) {
        *(undefined4 *)dvalue = 1;
        if (in_EDX == 1) {
          *(undefined2 *)(ii + local_38 * 2) = in_R8W;
        }
        else {
          *(undefined1 *)(in_R9 + local_38) = 1;
        }
      }
      else {
        *(undefined2 *)(ii + local_38 * 2) = *(undefined2 *)((long)in_RDI + local_38 * 2);
      }
    }
  }
  return *(int *)nullarray;
}

Assistant:

int fffi2i2(short *input,         /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            short tnull,          /* I - value of FITS TNULLn keyword if any */
            short nullval,        /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            short *output,        /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            memmove(output, input, ntodo * sizeof(short) );
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DSHRT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = SHRT_MIN;
                }
                else if (dvalue > DSHRT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = SHRT_MAX;
                }
                else
                    output[ii] = (short) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                    output[ii] = input[ii];
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DSHRT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = SHRT_MIN;
                    }
                    else if (dvalue > DSHRT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = SHRT_MAX;
                    }
                    else
                        output[ii] = (short) dvalue;
                }
            }
        }
    }
    return(*status);
}